

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# access.c
# Opt level: O3

void CheckASCII(TidyDocImpl *doc,Node *node)

{
  char cVar1;
  Node *pNVar2;
  tmbstr ptVar3;
  bool bVar4;
  Bool BVar5;
  uint uVar6;
  AttVal *pAVar7;
  int iVar8;
  tmbstr ptVar9;
  uint uVar10;
  ulong uVar11;
  long lVar12;
  ctmbstr cp;
  char *pcVar13;
  
  uVar6 = (doc->access).PRIORITYCHK;
  if ((uVar6 - 4 < 0xfffffffd) || (pNVar2 = node->content, pNVar2 == (Node *)0x0)) {
LAB_00152564:
    bVar4 = false;
  }
  else {
    uVar10 = pNVar2->start;
    if (pNVar2->end <= uVar10 + 1) goto LAB_00152564;
    ptVar3 = doc->lexer->lexbuf;
    uVar11 = (ulong)(uVar10 + 1);
    ptVar9 = ptVar3 + uVar11;
    iVar8 = -1;
    do {
      cVar1 = ptVar3[uVar11];
      iVar8 = (uint)(cVar1 == '\n') + iVar8;
      lVar12 = 0;
      if (uVar11 < uVar10 + 6) {
        lVar12 = 0;
        while (ptVar9[lVar12] == cVar1) {
          lVar12 = lVar12 + 1;
          if ((int)lVar12 == 5) goto LAB_001524fa;
        }
        if (4 < (uint)lVar12) break;
      }
      uVar10 = (uint)uVar11;
      uVar11 = uVar11 + 1;
      ptVar9 = ptVar9 + 1;
    } while (pNVar2->end != (uint)uVar11);
    if (iVar8 < 6 && (int)lVar12 < 5) goto LAB_00152564;
LAB_001524fa:
    bVar4 = true;
    if (((node->prev != (Node *)0x0) && (pNVar2 = node->prev->prev, pNVar2 != (Node *)0x0)) &&
       (pAVar7 = pNVar2->attributes, pAVar7 != (AttVal *)0x0)) {
      ptVar9 = (tmbstr)0x0;
      iVar8 = 0;
      do {
        if (((pAVar7->dict != (Attribute *)0x0) && (pAVar7->dict->id == TidyAttr_HREF)) &&
           (pcVar13 = pAVar7->value, pcVar13 != (char *)0x0)) {
          do {
            if (*pcVar13 == '\0') goto LAB_00152552;
            BVar5 = prvTidyIsWhite((int)*pcVar13);
            pcVar13 = pcVar13 + 1;
          } while (BVar5 != no);
          ptVar9 = pAVar7->value;
          iVar8 = iVar8 + 1;
        }
LAB_00152552:
        bVar4 = true;
        pAVar7 = pAVar7->next;
      } while (pAVar7 != (AttVal *)0x0);
      uVar6 = (doc->access).PRIORITYCHK;
      goto LAB_0015256c;
    }
  }
  iVar8 = 0;
  ptVar9 = (char *)0x0;
LAB_0015256c:
  if ((uVar6 & 0xfffffffe) == 2) {
    if (iVar8 == 1) {
      pNVar2 = node->next;
      iVar8 = 1;
      if (((pNVar2 != (Node *)0x0) && (pNVar2->tag != (Dict *)0x0)) &&
         ((pNVar2->tag->id == TidyTag_A && (pAVar7 = pNVar2->attributes, pAVar7 != (AttVal *)0x0))))
      {
        iVar8 = 1;
        do {
          if (((pAVar7->dict != (Attribute *)0x0) && (pAVar7->dict->id == TidyAttr_NAME)) &&
             (pcVar13 = pAVar7->value, pcVar13 != (char *)0x0)) {
            do {
              if (*pcVar13 == '\0') goto LAB_001525fc;
              BVar5 = prvTidyIsWhite((int)*pcVar13);
              pcVar13 = pcVar13 + 1;
            } while (BVar5 != no);
            pcVar13 = strstr(ptVar9,pAVar7->value);
            iVar8 = (iVar8 + 1) - (uint)(pcVar13 == (char *)0x0);
          }
LAB_001525fc:
          pAVar7 = pAVar7->next;
        } while (pAVar7 != (AttVal *)0x0);
      }
    }
    if (((bVar4) && (prvTidyReportAccessError(doc,node,0x2a9), (doc->access).PRIORITYCHK == 3)) &&
       (iVar8 < 2)) {
      prvTidyReportAccessError(doc,node,0x30b);
      return;
    }
  }
  return;
}

Assistant:

static void CheckASCII( TidyDocImpl* doc, Node* node )
{
    Node* temp1;
    Node* temp2;

    tmbstr skipOver = NULL;
    Bool IsAscii = no;
    int HasSkipOverLink = 0;
        
    uint i, x;
    int newLines = -1;
    tmbchar compareLetter;
    int matchingCount = 0;
    AttVal* av;
    
    if (Level1_Enabled( doc ) && node->content)
    {
        /* 
           Checks the text within the PRE and XMP tags to see if ascii 
           art is present 
        */
        for (i = node->content->start + 1; i < node->content->end; i++)
        {
            matchingCount = 0;

            /* Counts the number of lines of text */
            if (doc->lexer->lexbuf[i] == '\n')
            {
                newLines++;
            }
            
            compareLetter = doc->lexer->lexbuf[i];

            /* Counts consecutive character matches */
            for (x = i; x < i + 5; x++)
            {
                if (doc->lexer->lexbuf[x] == compareLetter)
                {
                    matchingCount++;
                }

                else
                {
                    break;
                }
            }

            /* Must have at least 5 consecutive character matches */
            if (matchingCount >= 5)
            {
                break;
            }
        }

        /* 
           Must have more than 6 lines of text OR 5 or more consecutive 
           letters that are the same for there to be ascii art 
        */
        if (newLines >= 6 || matchingCount >= 5)
        {
            IsAscii = yes;
        }

        /* Checks for skip over link if ASCII art is present */
        if (IsAscii == yes)
        {
            if (node->prev != NULL && node->prev->prev != NULL)
            {
                temp1 = node->prev->prev;

                /* Checks for 'HREF' attribute */
                for (av = temp1->attributes; av != NULL; av = av->next)
                {
                    if ( attrIsHREF(av) && hasValue(av) )
                    {
                        skipOver = av->value;
                        HasSkipOverLink++;
                    }
                }
            }
        }
    }

    if (Level2_Enabled( doc ))
    {
        /* 
           Checks for A element following PRE to ensure proper skipover link
           only if there is an A element preceding PRE.
        */
        if (HasSkipOverLink == 1)
        {
            if ( nodeIsA(node->next) )
            {
                temp2 = node->next;
                
                /* Checks for 'NAME' attribute */
                for (av = temp2->attributes; av != NULL; av = av->next)
                {
                    if ( attrIsNAME(av) && hasValue(av) )
                    {
                        /* 
                           Value within the 'HREF' attribute must be the same
                           as the value within the 'NAME' attribute for valid
                           skipover.
                        */
                        if ( strstr(skipOver, av->value) != NULL )
                        {
                            HasSkipOverLink++;
                        }
                    }
                }
            }
        }

        if (IsAscii == yes)
        {
            TY_(ReportAccessError)( doc, node, ASCII_REQUIRES_DESCRIPTION);
            if (Level3_Enabled( doc ) && (HasSkipOverLink < 2))
                TY_(ReportAccessError)( doc, node, SKIPOVER_ASCII_ART);
        }

    }
}